

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

ImFont * __thiscall
ImFontAtlas::AddFontFromFileTTF
          (ImFontAtlas *this,char *filename,float size_pixels,ImFontConfig *font_cfg_template,
          ImWchar *glyph_ranges)

{
  char *pcVar1;
  int iVar2;
  void *pvVar3;
  size_t sVar4;
  char *pcVar5;
  ImFont *pIVar6;
  size_t data_size;
  size_t local_170;
  float local_168;
  undefined1 local_150 [12];
  undefined1 local_144;
  undefined8 local_138;
  undefined4 local_10c;
  undefined8 local_100;
  undefined2 local_f8;
  char local_f6 [54];
  ImFontConfig local_c0;
  
  local_170 = 0;
  local_168 = size_pixels;
  pvVar3 = ImFileLoadToMemory(filename,"rb",&local_170,0);
  if (pvVar3 == (void *)0x0) {
    return (ImFont *)0x0;
  }
  if (font_cfg_template == (ImFontConfig *)0x0) {
    memset(local_150,0,0x90);
    local_144 = 1;
    local_138 = 0x100000002;
    local_10c = 0x7f7fffff;
    local_100 = 0x3f8000003f800000;
    local_f8 = 0xffff;
  }
  else {
    memcpy(local_150,font_cfg_template,0x90);
    if (local_f6[0] != '\0') goto LAB_001a251d;
  }
  sVar4 = strlen(filename);
  pcVar5 = filename + sVar4;
  do {
    if ((pcVar5 <= filename) || (pcVar1 = pcVar5 + -1, *pcVar1 == '\\')) break;
    pcVar5 = pcVar5 + -1;
  } while (*pcVar1 != '/');
  ImFormatString(local_f6,0x28,"%s, %.0fpx",(double)local_168);
LAB_001a251d:
  iVar2 = (int)local_170;
  memcpy(&local_c0,local_150,0x90);
  local_c0.FontDataSize = iVar2;
  local_c0.SizePixels =
       (float)(~-(uint)(0.0 < local_168) & (uint)local_c0.SizePixels |
              (uint)local_168 & -(uint)(0.0 < local_168));
  if (glyph_ranges != (ImWchar *)0x0) {
    local_c0.GlyphRanges = glyph_ranges;
  }
  local_c0.FontData = pvVar3;
  pIVar6 = AddFont(this,&local_c0);
  return pIVar6;
}

Assistant:

ImFont* ImFontAtlas::AddFontFromFileTTF(const char* filename, float size_pixels, const ImFontConfig* font_cfg_template, const ImWchar* glyph_ranges)
{
    IM_ASSERT(!Locked && "Cannot modify a locked ImFontAtlas between NewFrame() and EndFrame/Render()!");
    size_t data_size = 0;
    void* data = ImFileLoadToMemory(filename, "rb", &data_size, 0);
    if (!data)
    {
        IM_ASSERT_USER_ERROR(0, "Could not load font file!");
        return NULL;
    }
    ImFontConfig font_cfg = font_cfg_template ? *font_cfg_template : ImFontConfig();
    if (font_cfg.Name[0] == '\0')
    {
        // Store a short copy of filename into into the font name for convenience
        const char* p;
        for (p = filename + strlen(filename); p > filename && p[-1] != '/' && p[-1] != '\\'; p--) {}
        ImFormatString(font_cfg.Name, IM_ARRAYSIZE(font_cfg.Name), "%s, %.0fpx", p, size_pixels);
    }
    return AddFontFromMemoryTTF(data, (int)data_size, size_pixels, &font_cfg, glyph_ranges);
}